

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_bit_color_map.hpp
# Opt level: O0

void __thiscall
boost::
two_bit_color_map<boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>_>
::two_bit_color_map(two_bit_color_map<boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>_>
                    *this,size_t n,
                   vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>
                   *index)

{
  long in_RSI;
  long *in_RDI;
  uchar *in_stack_ffffffffffffffb8;
  shared_array<unsigned_char> *this_00;
  uchar *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  *in_RDI = in_RSI;
  this_00 = (shared_array<unsigned_char> *)(in_RDI + 2);
  operator_new__(in_RSI + 3U >> 2);
  shared_array<unsigned_char>::shared_array<unsigned_char>
            ((shared_array<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
            );
  shared_array<unsigned_char>::get(this_00);
  shared_array<unsigned_char>::get(this_00);
  std::fill<unsigned_char*,int>((uchar *)this_00,in_stack_ffffffffffffffb8,(int *)0xb6f93b);
  return;
}

Assistant:

explicit two_bit_color_map(std::size_t n, const IndexMap& index = IndexMap())
    : n(n), index(index), data(new unsigned char[(n + elements_per_char - 1) / elements_per_char])
  {
    // Fill to white
    std::fill(data.get(), data.get() + (n + elements_per_char - 1) / elements_per_char, 0);
  }